

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tria_o2.cc
# Opt level: O3

MatrixXd * __thiscall
lf::geometry::TriaO2::Global(MatrixXd *__return_storage_ptr__,TriaO2 *this,MatrixXd *local)

{
  undefined1 auVar1 [16];
  PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *dst;
  runtime_error *this_00;
  undefined8 *puVar2;
  double *pdVar3;
  long lVar4;
  ActualDstType actualDst;
  CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false>,_const_Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false>_>
  *pCVar5;
  RhsNested **pppMVar6;
  bool bVar7;
  long lVar8;
  double dVar9;
  long lVar10;
  long lVar11;
  byte bVar12;
  stringstream ss;
  scalar_sum_op<double,_double> local_529;
  PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *local_528;
  Rhs local_520;
  undefined1 local_508 [128];
  undefined1 local_488 [32];
  XprTypeNested XStack_468;
  LhsNested local_450;
  undefined8 local_448 [9];
  variable_if_dynamic<long,__1> local_400;
  Lhs local_3c8;
  Rhs local_3b8;
  CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Product<Eigen::Matrix<double,__1,_2,_0,__1,_2>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0>,_const_Eigen::Product<Eigen::Matrix<double,__1,_2,_0,__1,_2>,_Eigen::MatrixWrapper<const_Eigen::CwiseUnaryOp<Eigen::internal::scalar_square_op<double>,_const_Eigen::ArrayWrapper<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>_>,_0>_>,_const_Eigen::Product<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false>,_const_Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false>_>,_0>_>
  local_3a8;
  Product<Eigen::Matrix<double,__1,_2,_0,__1,_2>,_Eigen::MatrixWrapper<const_Eigen::CwiseUnaryOp<Eigen::internal::scalar_square_op<double>,_const_Eigen::ArrayWrapper<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>_>,_0>
  local_2e8;
  Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false> local_2d0;
  undefined1 local_298 [16];
  ostream local_288 [8];
  scalar_constant_op<double> local_280;
  RhsNested local_278;
  MatrixTypeNested local_1d0;
  variable_if_dynamic<long,__1> local_1c0;
  CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Product<Eigen::Matrix<double,__1,_2,_0,__1,_2>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0>,_const_Eigen::Product<Eigen::Matrix<double,__1,_2,_0,__1,_2>,_Eigen::MatrixWrapper<const_Eigen::CwiseUnaryOp<Eigen::internal::scalar_square_op<double>,_const_Eigen::ArrayWrapper<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>_>,_0>_>
  local_110;
  Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false> local_e0;
  CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false>,_const_Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false>_>
  local_a8;
  
  bVar12 = 0;
  local_3a8._0_8_ = (pointer)0x0;
  local_a8.m_lhs.
  super_BlockImpl<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false,_Eigen::Dense>.
  super_BlockImpl_dense<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false,_true>.
  super_MapBase<Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false>,_0>.
  m_data = (PointerType)local;
  Eigen::
  CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Array<double,_-1,_-1,_0,_-1,_-1>_>
  ::CwiseNullaryOp((CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Array<double,__1,__1,_0,__1,__1>_>
                    *)local_488,
                   (local->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).
                   m_storage.m_rows,
                   (local->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).
                   m_storage.m_cols,(scalar_constant_op<double> *)&local_3a8);
  Eigen::
  CwiseBinaryOp<Eigen::internal::scalar_cmp_op<double,_double,_(Eigen::internal::ComparisonName)2>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Array<double,_-1,_-1,_0,_-1,_-1>_>,_const_Eigen::ArrayWrapper<const_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>_>
  ::CwiseBinaryOp((CwiseBinaryOp<Eigen::internal::scalar_cmp_op<double,_double,_(Eigen::internal::ComparisonName)2>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Array<double,__1,__1,_0,__1,__1>_>,_const_Eigen::ArrayWrapper<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
                   *)local_298,
                  (CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Array<double,__1,__1,_0,__1,__1>_>
                   *)local_488,(Rhs *)&local_a8,
                  (scalar_cmp_op<double,_double,_(Eigen::internal::ComparisonName)2> *)&local_3a8);
  lVar4 = ((local_278.m_expression)->
          super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.m_cols;
  if (0 < lVar4) {
    pdVar3 = ((local_278.m_expression)->
             super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.m_data;
    lVar11 = ((local_278.m_expression)->
             super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.m_rows;
    bVar7 = false;
    lVar8 = 0;
    do {
      if (0 < lVar11) {
        lVar10 = 0;
        do {
          if (pdVar3[lVar10] < local_280.m_other) goto LAB_003816e2;
          lVar10 = lVar10 + 1;
        } while (lVar11 != lVar10);
      }
      lVar8 = lVar8 + 1;
      pdVar3 = pdVar3 + lVar11;
      bVar7 = lVar4 <= lVar8;
    } while (lVar8 != lVar4);
LAB_003816e2:
    if (!bVar7) goto LAB_0038197c;
  }
  local_508._0_8_ = &DAT_3ff0000000000000;
  local_2d0.
  super_BlockImpl<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false,_Eigen::Dense>.
  super_BlockImpl_dense<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false,_true>.
  super_MapBase<Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false>,_0>.
  m_data = (PointerType)local;
  Eigen::
  CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Array<double,_-1,_-1,_0,_-1,_-1>_>
  ::CwiseNullaryOp((CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Array<double,__1,__1,_0,__1,__1>_>
                    *)&local_3a8,
                   (local->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).
                   m_storage.m_rows,
                   (local->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).
                   m_storage.m_cols,(scalar_constant_op<double> *)local_508);
  Eigen::
  CwiseBinaryOp<Eigen::internal::scalar_cmp_op<double,_double,_(Eigen::internal::ComparisonName)2>,_const_Eigen::ArrayWrapper<const_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Array<double,_-1,_-1,_0,_-1,_-1>_>_>
  ::CwiseBinaryOp((CwiseBinaryOp<Eigen::internal::scalar_cmp_op<double,_double,_(Eigen::internal::ComparisonName)2>,_const_Eigen::ArrayWrapper<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Array<double,__1,__1,_0,__1,__1>_>_>
                   *)local_488,(Lhs *)&local_2d0,
                  (CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Array<double,__1,__1,_0,__1,__1>_>
                   *)&local_3a8,
                  (scalar_cmp_op<double,_double,_(Eigen::internal::ComparisonName)2> *)local_508);
  local_528 = &__return_storage_ptr__->
               super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>;
  if (0 < (long)local_488._16_8_) {
    lVar4 = *(long *)local_488._0_8_;
    bVar7 = false;
    dVar9 = 0.0;
    do {
      if (0 < (long)local_488._8_8_) {
        lVar11 = 0;
        do {
          if ((double)local_488._24_8_ < *(double *)(lVar4 + lVar11 * 8)) goto LAB_0038179b;
          lVar11 = lVar11 + 1;
        } while (local_488._8_8_ != lVar11);
      }
      dVar9 = (double)((long)dVar9 + 1);
      lVar4 = lVar4 + *(Index *)(local_488._0_8_ + 8) * 8;
      bVar7 = (long)local_488._16_8_ <= (long)dVar9;
    } while (dVar9 != (double)local_488._16_8_);
LAB_0038179b:
    if (!bVar7) {
LAB_0038197c:
      std::__cxx11::stringstream::stringstream((stringstream *)local_298);
      std::__ostream_insert<char,std::char_traits<char>>
                (local_288,"local coordinates out of bounds for reference element",0x35);
      local_488._0_8_ = (NestedExpressionType)(local_488 + 0x10);
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_488,"(0. <= local.array()).all() && (local.array() <= 1.).all()",""
                );
      pppMVar6 = (RhsNested **)&local_3a8.m_lhs.m_lhs.m_rhs;
      local_3a8._0_8_ = pppMVar6;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_3a8,
                 "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/geometry/tria_o2.cc"
                 ,"");
      std::__cxx11::stringbuf::str();
      base::AssertionFailed((string *)local_488,(string *)&local_3a8,0x34,(string *)local_508);
      if ((undefined1 *)local_508._0_8_ != local_508 + 0x10) {
        operator_delete((void *)local_508._0_8_,local_508._16_8_ + 1);
      }
      if ((RhsNested **)local_3a8._0_8_ != pppMVar6) {
        operator_delete((void *)local_3a8._0_8_,(long)local_3a8.m_lhs.m_lhs.m_rhs + 1);
      }
      if ((NestedExpressionType)local_488._0_8_ != (NestedExpressionType)(local_488 + 0x10)) {
        operator_delete((void *)local_488._0_8_,local_488._16_8_ + 1);
      }
      this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(this_00,"this code should not be reached");
      __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
  }
  Eigen::
  Product<Eigen::Matrix<double,_-1,_2,_0,_-1,_2>,_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_0>::
  Product((Product<Eigen::Matrix<double,__1,_2,_0,__1,_2>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0>
           *)local_298,&this->beta_,local);
  local_3c8.m_lhs = (LhsNested)local_298._0_8_;
  local_3c8.m_rhs = (RhsNested)local_298._8_8_;
  local_3b8.m_expression.m_xpr.m_expression = local;
  Eigen::
  Product<Eigen::Matrix<double,_-1,_2,_0,_-1,_2>,_Eigen::MatrixWrapper<const_Eigen::CwiseUnaryOp<Eigen::internal::scalar_square_op<double>,_const_Eigen::ArrayWrapper<const_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>_>_>,_0>
  ::Product(&local_2e8,&this->gamma_,&local_3b8);
  Eigen::
  CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Product<Eigen::Matrix<double,_-1,_2,_0,_-1,_2>,_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_0>,_const_Eigen::Product<Eigen::Matrix<double,_-1,_2,_0,_-1,_2>,_Eigen::MatrixWrapper<const_Eigen::CwiseUnaryOp<Eigen::internal::scalar_square_op<double>,_const_Eigen::ArrayWrapper<const_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>_>_>,_0>_>
  ::CwiseBinaryOp(&local_110,&local_3c8,&local_2e8,(scalar_sum_op<double,_double> *)local_298);
  Eigen::Block<const_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1,_-1,_false>::Block
            (&local_2d0,local,0);
  Eigen::Block<const_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1,_-1,_false>::Block
            (&local_e0,local,1);
  Eigen::
  CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<const_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1,_-1,_false>,_const_Eigen::Block<const_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1,_-1,_false>_>
  ::CwiseBinaryOp(&local_a8,&local_2d0,&local_e0,(scalar_product_op<double,_double> *)local_298);
  pCVar5 = &local_a8;
  puVar2 = (undefined8 *)(local_508 + 8);
  for (lVar4 = 0xe; lVar4 != 0; lVar4 = lVar4 + -1) {
    *puVar2 = (pCVar5->m_lhs).
              super_BlockImpl<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false,_Eigen::Dense>
              .
              super_BlockImpl_dense<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false,_true>
              .
              super_MapBase<Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false>,_0>
              .m_data;
    pCVar5 = (CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false>,_const_Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false>_>
              *)((long)pCVar5 + (ulong)bVar12 * -0x10 + 8);
    puVar2 = puVar2 + (ulong)bVar12 * -2 + 1;
  }
  local_508._0_8_ = &this->delta_;
  Eigen::
  CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Product<Eigen::Matrix<double,_-1,_2,_0,_-1,_2>,_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_0>,_const_Eigen::Product<Eigen::Matrix<double,_-1,_2,_0,_-1,_2>,_Eigen::MatrixWrapper<const_Eigen::CwiseUnaryOp<Eigen::internal::scalar_square_op<double>,_const_Eigen::ArrayWrapper<const_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>_>_>,_0>_>,_const_Eigen::Product<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<const_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1,_-1,_false>,_const_Eigen::Block<const_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1,_-1,_false>_>,_0>_>
  ::CwiseBinaryOp(&local_3a8,&local_110,(Rhs *)local_508,(scalar_sum_op<double,_double> *)local_298)
  ;
  local_488._8_8_ = local_3a8.m_lhs.m_lhs.m_lhs;
  local_488._16_8_ = local_3a8.m_lhs.m_lhs.m_rhs;
  local_488._24_8_ = local_3a8.m_lhs.m_rhs.m_lhs;
  XStack_468.m_expression = local_3a8.m_lhs.m_rhs.m_rhs.m_expression.m_xpr.m_expression;
  local_450 = local_3a8.m_rhs.m_lhs;
  pppMVar6 = (RhsNested **)&local_3a8.m_rhs.m_rhs;
  puVar2 = local_448;
  for (lVar4 = 0xe; lVar4 != 0; lVar4 = lVar4 + -1) {
    *puVar2 = *pppMVar6;
    pppMVar6 = pppMVar6 + (ulong)bVar12 * -2 + 1;
    puVar2 = puVar2 + (ulong)bVar12 * -2 + 1;
  }
  local_520.m_matrix = &this->alpha_;
  local_520.m_colFactor.m_value = local_400.m_value;
  Eigen::
  CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Product<Eigen::Matrix<double,_-1,_2,_0,_-1,_2>,_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_0>,_const_Eigen::Product<Eigen::Matrix<double,_-1,_2,_0,_-1,_2>,_Eigen::MatrixWrapper<const_Eigen::CwiseUnaryOp<Eigen::internal::scalar_square_op<double>,_const_Eigen::ArrayWrapper<const_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>_>_>,_0>_>,_const_Eigen::Product<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<const_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1,_-1,_false>,_const_Eigen::Block<const_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1,_-1,_false>_>,_0>_>,_const_Eigen::Replicate<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1,_-1>_>
  ::CwiseBinaryOp((CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Product<Eigen::Matrix<double,__1,_2,_0,__1,_2>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0>,_const_Eigen::Product<Eigen::Matrix<double,__1,_2,_0,__1,_2>,_Eigen::MatrixWrapper<const_Eigen::CwiseUnaryOp<Eigen::internal::scalar_square_op<double>,_const_Eigen::ArrayWrapper<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>_>,_0>_>,_const_Eigen::Product<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false>,_const_Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false>_>,_0>_>,_const_Eigen::Replicate<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1,__1>_>
                   *)local_298,(Lhs *)local_488,&local_520,&local_529);
  dst = local_528;
  (local_528->m_storage).m_data = (double *)0x0;
  (local_528->m_storage).m_rows = 0;
  (local_528->m_storage).m_cols = 0;
  lVar4 = (local_1d0->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
          m_rows;
  if ((local_1c0.m_value != 0 && lVar4 != 0) &&
     (auVar1 = ZEXT816(0) << 0x40 | ZEXT816(0x7fffffffffffffff),
     SUB168(auVar1 / SEXT816(local_1c0.m_value),0) < lVar4)) {
    puVar2 = (undefined8 *)
             __cxa_allocate_exception(8,lVar4,SUB168(auVar1 % SEXT816(local_1c0.m_value),0));
    *puVar2 = &std::out_of_range::vtable;
    __cxa_throw(puVar2,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
  }
  Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::resize
            (local_528,lVar4,local_1c0.m_value);
  Eigen::internal::
  call_dense_assignment_loop<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::Product<Eigen::Matrix<double,_1,2,0,_1,2>,Eigen::Matrix<double,_1,_1,0,_1,_1>,0>const,Eigen::Product<Eigen::Matrix<double,_1,2,0,_1,2>,Eigen::MatrixWrapper<Eigen::CwiseUnaryOp<Eigen::internal::scalar_square_op<double>,Eigen::ArrayWrapper<Eigen::Matrix<double,_1,_1,0,_1,_1>const>const>const>,0>const>const,Eigen::Product<Eigen::Matrix<double,_1,1,0,_1,1>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>const,1,_1,false>const,Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>const,1,_1,false>const>,0>const>const,Eigen::Replicate<Eigen::Matrix<double,_1,1,0,_1,1>,1,_1>const>,Eigen::internal::assign_op<double,double>>
            ((Matrix<double,__1,__1,_0,__1,__1> *)dst,
             (CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Product<Eigen::Matrix<double,__1,_2,_0,__1,_2>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0>,_const_Eigen::Product<Eigen::Matrix<double,__1,_2,_0,__1,_2>,_Eigen::MatrixWrapper<const_Eigen::CwiseUnaryOp<Eigen::internal::scalar_square_op<double>,_const_Eigen::ArrayWrapper<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>_>,_0>_>,_const_Eigen::Product<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false>,_const_Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false>_>,_0>_>,_const_Eigen::Replicate<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1,__1>_>
              *)local_298,(assign_op<double,_double> *)&local_520);
  return (MatrixXd *)dst;
}

Assistant:

Eigen::MatrixXd TriaO2::Global(const Eigen::MatrixXd& local) const {
  LF_VERIFY_MSG((0. <= local.array()).all() && (local.array() <= 1.).all(),
                "local coordinates out of bounds for reference element");
  // Direct vectorized evaluation of componentwise quadratic mapping
  // given through its monomial coefficients.
  return ((beta_ * local) + (gamma_ * local.array().square().matrix()) +
          (delta_ * local.row(0).cwiseProduct(local.row(1))))
             .colwise() +
         alpha_;
}